

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O1

bool loadEnvmapTexture(void)

{
  char *filename;
  GLboolean GVar1;
  bool bVar2;
  GLenum GVar3;
  djg_texture *texture;
  
  fwrite("Loading {Envmap-Texture}\n",0x19,1,_stdout);
  fflush(_stdout);
  if (g_sphere.shading.envmap.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      g_sphere.shading.envmap.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    filename = g_sphere.shading.envmap.files.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[g_sphere.shading.envmap.id];
    GVar1 = (*glad_glIsTexture)(g_gl.textures[3]);
    if (GVar1 != '\0') {
      (*glad_glDeleteTextures)(1,g_gl.textures + 3);
    }
    (*glad_glGenTextures)(1,g_gl.textures + 3);
    texture = (djg_texture *)malloc(0x20);
    texture->next = (djg_texture *)0x0;
    texture->texels = (char *)0x0;
    texture->x = 0;
    texture->y = 0;
    texture->comp = 0;
    texture->pf = 0;
    (*glad_glActiveTexture)(0x84c3);
    djgt_push_image_hdr(texture,filename,true);
    bVar2 = djgt_to_gl(texture,0xde1,0x8c3d,true,true,g_gl.textures + 3);
    if (bVar2) {
      (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
      (*glad_glActiveTexture)(0x84c0);
    }
    else {
      fwrite("=> Failure <=\n",0xe,1,_stdout);
      fflush(_stdout);
    }
    djgt_release(texture);
    if (!bVar2) {
      return false;
    }
  }
  GVar3 = (*glad_glGetError)();
  return GVar3 == 0;
}

Assistant:

bool loadEnvmapTexture()
{
    LOG("Loading {Envmap-Texture}\n");
    if (!g_sphere.shading.envmap.files.empty()) {
        int id = g_sphere.shading.envmap.id;
        const char *path = g_sphere.shading.envmap.files[id];

        if (glIsTexture(g_gl.textures[TEXTURE_ENVMAP]))
            glDeleteTextures(1, &g_gl.textures[TEXTURE_ENVMAP]);
        glGenTextures(1, &g_gl.textures[TEXTURE_ENVMAP]);

        djg_texture *djgt = djgt_create(0);
        GLuint *glt = &g_gl.textures[TEXTURE_ENVMAP];

        glActiveTexture(GL_TEXTURE0 + TEXTURE_ENVMAP);
        djgt_push_image_hdr(djgt, path, 1);

        if (!djgt_to_gl(djgt, GL_TEXTURE_2D, GL_RGB9_E5, 1, 1, glt)) {
            LOG("=> Failure <=\n");
            djgt_release(djgt);

            return false;
        }
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
        glActiveTexture(GL_TEXTURE0);

        djgt_release(djgt);
    }
    return (glGetError() == GL_NO_ERROR);
}